

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweeper.c
# Opt level: O3

void Gia_ManCollectSuper_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vSuper)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  Gia_Obj_t *pGVar5;
  
  iVar4 = 1;
  if (((ulong)pObj & 1) == 0) {
    if (((uint)*(undefined8 *)pObj & 0x9fffffff) != 0x9fffffff &&
        ((byte)((ulong)*(undefined8 *)pObj >> 0x3e) & 1) == 0) {
      while (iVar2 = Gia_ObjIsMuxType(pObj), iVar2 == 0) {
        Gia_ManCollectSuper_rec
                  (p,(Gia_Obj_t *)
                     ((ulong)((uint)(*(ulong *)pObj >> 0x1d) & 1) ^
                     (ulong)(pObj + -(*(ulong *)pObj & 0x1fffffff))),vSuper);
        pObj = (Gia_Obj_t *)
               ((ulong)((uint)(*(ulong *)pObj >> 0x3d) & 1) ^
               (ulong)(pObj + -(*(ulong *)pObj >> 0x20 & 0x1fffffff)));
        if (((ulong)pObj & 1) != 0) goto LAB_0077f662;
        if (((*(ulong *)pObj & 0x4000000000000000) != 0) ||
           (((uint)*(ulong *)pObj & 0x9fffffff) == 0x9fffffff)) break;
      }
    }
    iVar4 = 0;
  }
LAB_0077f662:
  pGVar5 = (Gia_Obj_t *)((ulong)pObj & 0xfffffffffffffffe);
  pGVar1 = p->pObjs;
  if ((pGVar1 <= pGVar5) && (pGVar5 < pGVar1 + p->nObjs)) {
    iVar2 = (int)((ulong)((long)pGVar5 - (long)pGVar1) >> 2);
    if (iVar2 * -0x55555555 < 0) {
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                    ,0xf1,"int Abc_Var2Lit(int, int)");
    }
    iVar4 = iVar4 + iVar2 * 0x55555556;
    if (0 < (long)vSuper->nSize) {
      lVar3 = 0;
      do {
        if (vSuper->pArray[lVar3] == iVar4) {
          return;
        }
        lVar3 = lVar3 + 1;
      } while (vSuper->nSize != lVar3);
    }
    Vec_IntPush(vSuper,iVar4);
    return;
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

static void Gia_ManCollectSuper_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vSuper )
{
    // stop at complements, shared, PIs, and MUXes
    if ( Gia_IsComplement(pObj) || pObj->fMark1 || Gia_ObjIsCi(pObj) || Gia_ObjIsMuxType(pObj) )
    {
        Vec_IntPushUnique( vSuper, Gia_Obj2Lit(p, pObj) );
        return;
    }
    Gia_ManCollectSuper_rec( p, Gia_ObjChild0(pObj), vSuper );
    Gia_ManCollectSuper_rec( p, Gia_ObjChild1(pObj), vSuper );
}